

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_make_dir(char *file,wchar_t line,char *dirname,wchar_t mode)

{
  int iVar1;
  __mode_t in_ECX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = mkdir(in_RDX,in_ECX);
  if (iVar1 != 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Could not create directory %s",in_RDX);
    failure_finish((void *)0x11e159);
  }
  local_4 = (wchar_t)(iVar1 == 0);
  return local_4;
}

Assistant:

int
assertion_make_dir(const char *file, int line, const char *dirname, int mode)
{
	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
	if (0 == _mkdir(dirname))
		return (1);
#else
	if (0 == mkdir(dirname, mode))
		return (1);
#endif
	failure_start(file, line, "Could not create directory %s", dirname);
	failure_finish(NULL);
	return(0);
}